

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::checkExists(string *path)

{
  byte bVar1;
  Fatal *this;
  Fatal local_3b0;
  undefined1 local_218 [8];
  ifstream infile;
  string *path_local;
  
  std::ifstream::ifstream(local_218,path,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    ::wasm::Fatal::Fatal(&local_3b0);
    this = ::wasm::Fatal::operator<<(&local_3b0,(char (*) [17])"File not found: ");
    ::wasm::Fatal::operator<<(this,path);
    ::wasm::Fatal::~Fatal(&local_3b0);
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void checkExists(const std::string& path) {
  std::ifstream infile(path);
  if (!infile.is_open()) {
    Fatal() << "File not found: " << path;
  }
}